

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_integrate_pdf<trng::beta_dist<long_double>>(beta_dist<long_double> *d)

{
  undefined1 x [16];
  longdouble *extraout_RDX;
  longdouble *extraout_RDX_00;
  longdouble *extraout_RDX_01;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> last;
  beta_dist<long_double> *in_RSI;
  beta_dist<long_double> *__return_storage_ptr__;
  int iVar1;
  long lVar2;
  int iVar3;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar6;
  longdouble in_ST4;
  longdouble lVar7;
  longdouble in_ST5;
  longdouble lVar8;
  vector<long_double,_std::allocator<long_double>_> y;
  AssertionHandler catchAssertionHandler;
  undefined6 in_stack_fffffffffffffe82;
  vector<long_double,_std::allocator<long_double>_> local_128;
  longdouble local_108;
  longdouble local_fc;
  long local_f0;
  longdouble local_e8;
  AssertionHandler local_d8;
  longdouble local_88;
  SourceLineInfo local_78;
  ITransientExpression local_68;
  longdouble *local_58;
  char *local_50;
  size_t sStack_48;
  longdouble *local_40;
  StringRef local_38;
  
  __return_storage_ptr__ = d;
  roundl();
  local_f0 = (long)ROUND(in_ST0);
  lVar2 = 0x100000;
  if (local_f0 < 0x100000) {
    lVar2 = local_f0;
  }
  lVar5 = in_ST5;
  trng::math::detail::inv_Beta_I<long_double>
            ((longdouble *)__return_storage_ptr__,_DAT_002a76b0,*(longdouble *)&(d->P).alpha_,
             *(longdouble *)&(d->P).beta_,*(longdouble *)&(d->P).norm_);
  lVar6 = lVar5;
  trng::math::detail::inv_Beta_I<long_double>
            ((longdouble *)__return_storage_ptr__,_DAT_002a76c0,*(longdouble *)&(d->P).alpha_,
             *(longdouble *)&(d->P).beta_,*(longdouble *)&(d->P).norm_);
  iVar1 = (int)lVar2;
  local_108 = (longdouble)iVar1;
  local_fc = (in_ST2 - in_ST1) / local_108;
  local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (longdouble *)0x0;
  iVar3 = 0;
  last._M_current = extraout_RDX;
  if (-1 < iVar1) {
    lVar4 = in_ST3;
    lVar7 = lVar6;
    do {
      in_ST3 = in_ST4;
      x._10_6_ = in_stack_fffffffffffffe82;
      x._0_10_ = in_ST1 + local_fc * (longdouble)iVar3;
      lVar8 = lVar7;
      trng::beta_dist<long_double>::pdf((result_type_conflict3 *)d,in_RSI,(result_type_conflict3)x);
      if (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        in_RSI = (beta_dist<long_double> *)
                 local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                  (&local_128,
                   (iterator)
                   local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(longdouble *)&local_d8);
        last._M_current = extraout_RDX_01;
      }
      else {
        *local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
         super__Vector_impl_data._M_finish = lVar4;
        in_RSI = (beta_dist<long_double> *)
                 (local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1);
        last._M_current = extraout_RDX_00;
        local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_RSI;
      }
      iVar3 = iVar3 + 1;
      lVar4 = in_ST3;
      in_ST4 = in_ST5;
      in_ST5 = lVar5;
      lVar5 = lVar6;
      lVar6 = lVar7;
      lVar7 = lVar8;
    } while (iVar1 + 1 != iVar3);
  }
  simpson_int<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
            ((value_type *)
             local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
              )local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_finish,last);
  local_108 = ((longdouble)64.0 / local_108) / local_108;
  local_68._vptr_ITransientExpression = (_func_int **)0x2a6457;
  local_68.m_isBinaryExpression = true;
  local_68.m_result = false;
  local_68._10_6_ = 0;
  local_78.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_78.line = 0x94;
  local_88 = local_108;
  Catch::StringRef::StringRef(&local_38,"std::abs(s - result_type(98) / result_type(100)) < tol");
  Catch::AssertionHandler::AssertionHandler
            (&local_d8,(StringRef *)&local_68,&local_78,local_38,Normal);
  lVar5 = ABS(_DAT_002a76d0 + in_ST3 * local_fc);
  local_e8 = lVar5;
  Catch::StringRef::StringRef((StringRef *)&local_78,"<");
  local_68.m_result = lVar5 < local_108;
  local_68.m_isBinaryExpression = true;
  local_68._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00318338;
  local_58 = &local_e8;
  local_50 = local_78.file;
  sStack_48 = local_78.line;
  local_40 = &local_88;
  Catch::AssertionHandler::handleExpr(&local_d8,&local_68);
  Catch::ITransientExpression::~ITransientExpression(&local_68);
  Catch::AssertionHandler::complete(&local_d8);
  if (local_d8.m_completed == false) {
    (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if ((value_type *)
      local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start != (value_type *)0x0) {
    operator_delete(local_128.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}